

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void AnalyzeEnumConstants
               (ExpressionContext *ctx,TypeBase *type,IntrusiveList<SynConstant> constants,
               IntrusiveList<ConstantData> *target)

{
  ModuleData *pMVar1;
  TypeBase *pTVar2;
  SynIdentifier *pSVar3;
  int iVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ConstantData *pCVar6;
  ExprBase *pEVar7;
  _func_int **pp_Var8;
  ExpressionContext *ctx_00;
  IntrusiveList<ConstantData> *pIVar9;
  bool bVar10;
  InplaceStr name;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  ctx_00 = (ExpressionContext *)constants.head;
  if (ctx_00 != (ExpressionContext *)0x0) {
    pEVar7 = (ExprBase *)0x0;
    pIVar9 = target;
    do {
      pMVar1 = (ctx_00->uniqueDependencies).little[3];
      if (pMVar1 == (ModuleData *)0x0) {
        if (pEVar7 == (ExprBase *)0x0) {
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
          pp_Var8 = (_func_int **)0x0;
        }
        else {
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
          pp_Var8 = (_func_int **)((long)pEVar7[1]._vptr_ExprBase + 1);
        }
        pTVar2 = ctx->typeInt;
        pEVar5->typeID = 6;
        pEVar5->source = (SynBase *)ctx_00;
        pEVar5->type = pTVar2;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f63d0;
        pEVar5[1]._vptr_ExprBase = pp_Var8;
LAB_00203957:
        if (pEVar5 == (ExprBase *)0x0) {
          anon_unknown.dwarf_11255e::Report
                    (ctx,(SynBase *)ctx_00,"ERROR: expression didn\'t evaluate to a constant number"
                    );
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
          pTVar2 = ctx->typeInt;
          pEVar5->typeID = 6;
          pEVar5->source = (SynBase *)ctx_00;
          pEVar5->type = pTVar2;
          pEVar5->next = (ExprBase *)0x0;
          pEVar5->listed = false;
          pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f63d0;
          pEVar5[1]._vptr_ExprBase = (_func_int **)0x0;
        }
        for (pCVar6 = target->head; pCVar6 != (ConstantData *)0x0; pCVar6 = pCVar6->next) {
          bVar10 = InplaceStr::operator==
                             ((InplaceStr *)
                              &(ctx_00->uniqueDependencies).little[2]->importedFunctionCount,
                              &pCVar6->name->name);
          if (bVar10) {
            pIVar9 = (IntrusiveList<ConstantData> *)(pCVar6->name->name).begin;
            anon_unknown.dwarf_11255e::Report
                      (ctx,(SynBase *)ctx_00,"ERROR: name \'%.*s\' is already taken",
                       (ulong)(uint)(*(int *)&(pCVar6->name->name).end - (int)pIVar9));
          }
        }
        pMVar1 = (ctx_00->uniqueDependencies).little[2];
        name.end = (char *)pIVar9;
        name.begin = (char *)pMVar1[1].source;
        anon_unknown.dwarf_11255e::CheckVariableConflict
                  ((anon_unknown_dwarf_11255e *)ctx,ctx_00,
                   *(SynBase **)&pMVar1->importedFunctionCount,name);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pCVar6 = (ConstantData *)CONCAT44(extraout_var_02,iVar4);
        pSVar3 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[2];
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_03,iVar4);
        pp_Var8 = pEVar5[1]._vptr_ExprBase;
        pEVar7->typeID = 6;
        pEVar7->source = (SynBase *)ctx_00;
        pEVar7->type = type;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f63d0;
        pEVar7[1]._vptr_ExprBase = pp_Var8;
        pCVar6->name = pSVar3;
        pCVar6->value = pEVar7;
        pCVar6->next = (ConstantData *)0x0;
        pCVar6->listed = false;
        IntrusiveList<ConstantData>::push_back(target,pCVar6);
        pEVar7 = pEVar5;
      }
      else {
        pEVar5 = AnalyzeExpression(ctx,(SynBase *)pMVar1);
        pTVar2 = pEVar5->type;
        if (pTVar2 == (TypeBase *)0x0) {
          bVar10 = false;
        }
        else {
          bVar10 = pTVar2->typeID == 0;
        }
        if (bVar10) {
LAB_00203907:
          pEVar5 = (ExprBase *)0x0;
        }
        else {
          if (pTVar2 != type) {
            pIVar9 = (IntrusiveList<ConstantData> *)0x0;
            pEVar5 = CreateCast(ctx,(SynBase *)ctx_00,pEVar5,ctx->typeInt,false);
          }
          pEVar5 = anon_unknown.dwarf_11255e::EvaluateExpression(ctx,(SynBase *)ctx_00,pEVar5);
          if ((pEVar5 == (ExprBase *)0x0) || (pEVar5->typeID != 6)) goto LAB_00203907;
        }
        if (!bVar10) goto LAB_00203957;
      }
      ctx_00 = (ExpressionContext *)(ctx_00->uniqueDependencies).little[0];
      if ((ctx_00 == (ExpressionContext *)0x0) ||
         (*(int *)&((InplaceStr *)&ctx_00->code)->begin != 0x3a)) {
        ctx_00 = (ExpressionContext *)0x0;
      }
    } while (ctx_00 != (ExpressionContext *)0x0);
  }
  return;
}

Assistant:

void AnalyzeEnumConstants(ExpressionContext &ctx, TypeBase *type, IntrusiveList<SynConstant> constants, IntrusiveList<ConstantData> &target)
{
	ExprIntegerLiteral *last = NULL;

	for(SynConstant *constant = constants.head; constant; constant = getType<SynConstant>(constant->next))
	{
		ExprIntegerLiteral *value = NULL;
			
		if(constant->value)
		{
			ExprBase *rhs = AnalyzeExpression(ctx, constant->value);

			if(isType<TypeError>(rhs->type))
				continue;

			if(rhs->type == type)
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, rhs));
			else
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, CreateCast(ctx, constant, rhs, ctx.typeInt, false)));
		}
		else if(last)
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, last->value + 1);
		}
		else
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		if(!value)
		{
			Report(ctx, constant, "ERROR: expression didn't evaluate to a constant number");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		last = value;

		for(ConstantData *curr = target.head; curr; curr = curr->next)
		{
			if(constant->name->name == curr->name->name)
				Report(ctx, constant, "ERROR: name '%.*s' is already taken", FMT_ISTR(curr->name->name));
		}

		CheckVariableConflict(ctx, constant, constant->name->name);

		target.push_back(new (ctx.get<ConstantData>()) ConstantData(constant->name, new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, type, value->value)));
	}
}